

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<const_long_&,_const_int_&>::streamReconstructedExpression
          (BinaryExpr<const_long_&,_const_int_&> *this,ostream *os)

{
  StringRef SVar1;
  string local_60;
  string local_40;
  
  Detail::stringify<long>(&local_40,this->m_lhs);
  SVar1 = this->m_op;
  Detail::stringify<int>(&local_60,this->m_rhs);
  Catch::formatReconstructedExpression(os,(string *)&local_40,SVar1,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }